

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_FontFaceQuartet * __thiscall
ON_Font::FontQuartet(ON_FontFaceQuartet *__return_storage_ptr__,ON_Font *this)

{
  ON_Font *pOVar1;
  ON_Font *pOVar2;
  ON_Font *pOVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  wchar_t *pwVar7;
  ulong uVar8;
  ON_wString *pOVar9;
  long lVar10;
  ON_wString local_68;
  undefined1 local_60 [28];
  ON_SHA1_Hash local_44;
  
  bVar4 = ON_wString::IsNotEmpty(&this->m_loc_windows_logfont_name);
  pOVar9 = &this->m_en_windows_logfont_name;
  if (bVar4) {
    pOVar9 = &this->m_loc_windows_logfont_name;
  }
  ON_wString::ON_wString(&local_68,pOVar9);
  RichTextFontName((ON_Font *)local_60,this,false);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_68);
  FontNameHash((ON_SHA1_Hash *)(local_60 + 8),pwVar7,false);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_60);
  FontNameHash(&local_44,pwVar7,false);
  bVar4 = ON_wString::IsNotEmpty(&local_68);
  bVar5 = ON_wString::IsNotEmpty((ON_wString *)local_60);
  if (bVar5) {
    bVar6 = ON_wString::IsEmpty(&local_68);
    bVar5 = true;
    if (!bVar6) {
      bVar5 = ::operator!=((ON_SHA1_Hash *)(local_60 + 8),&local_44);
    }
  }
  else {
    bVar5 = false;
  }
  if ((bVar5 | bVar4) == 1) {
    uVar8 = (ulong)!bVar4;
    pOVar9 = &local_68 + uVar8;
    lVar10 = 0;
    if (uVar8 <= bVar5) {
      lVar10 = bVar5 - uVar8;
    }
    lVar10 = lVar10 + 1;
    do {
      ON_ManagedFonts::InstalledFonts();
      pwVar7 = ON_wString::operator_cast_to_wchar_t_(pOVar9);
      ON_FontList::QuartetFromQuartetName
                (__return_storage_ptr__,&ON_ManagedFonts::List.m_installed_fonts,pwVar7);
      if ((((__return_storage_ptr__->m_regular != (ON_Font *)0x0) ||
           (__return_storage_ptr__->m_bold != (ON_Font *)0x0)) ||
          (__return_storage_ptr__->m_italic != (ON_Font *)0x0)) ||
         (__return_storage_ptr__->m_bold_italic != (ON_Font *)0x0)) goto LAB_0048983c;
      ON_wString::~ON_wString(&__return_storage_ptr__->m_quartet_name);
      pOVar9 = pOVar9 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  if ((bVar5 | bVar4) == 1) {
    uVar8 = (ulong)!bVar4;
    lVar10 = 0;
    if (uVar8 <= bVar5) {
      lVar10 = bVar5 - uVar8;
    }
    pOVar9 = &local_68 + uVar8;
    lVar10 = lVar10 + 1;
    do {
      pwVar7 = ON_wString::operator_cast_to_wchar_t_(pOVar9);
      ON_FontList::QuartetFromQuartetName
                (__return_storage_ptr__,&ON_ManagedFonts::List.m_managed_fonts,pwVar7);
      if (((__return_storage_ptr__->m_regular != (ON_Font *)0x0) ||
          (__return_storage_ptr__->m_bold != (ON_Font *)0x0)) ||
         ((__return_storage_ptr__->m_italic != (ON_Font *)0x0 ||
          (__return_storage_ptr__->m_bold_italic != (ON_Font *)0x0)))) goto LAB_0048983c;
      ON_wString::~ON_wString(&__return_storage_ptr__->m_quartet_name);
      pOVar9 = pOVar9 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  ON_wString::ON_wString
            (&__return_storage_ptr__->m_quartet_name,&ON_FontFaceQuartet::Empty.m_quartet_name);
  pOVar3 = ON_FontFaceQuartet::Empty.m_bold_italic;
  pOVar2 = ON_FontFaceQuartet::Empty.m_bold;
  pOVar1 = ON_FontFaceQuartet::Empty.m_regular;
  __return_storage_ptr__->m_italic = ON_FontFaceQuartet::Empty.m_italic;
  __return_storage_ptr__->m_bold_italic = pOVar3;
  __return_storage_ptr__->m_regular = pOVar1;
  __return_storage_ptr__->m_bold = pOVar2;
LAB_0048983c:
  lVar10 = 8;
  do {
    ON_wString::~ON_wString((ON_wString *)((long)&local_68.m_s + lVar10));
    lVar10 = lVar10 + -8;
  } while (lVar10 != -8);
  return __return_storage_ptr__;
}

Assistant:

const ON_FontFaceQuartet ON_Font::FontQuartet() const
{
  const ON_wString quartet_name[2] = { QuartetName(), this->RichTextFontName() };
  const ON_SHA1_Hash quartet_name_hash[2] = { ON_Font::FontNameHash(quartet_name[0],false), ON_Font::FontNameHash(quartet_name[1],false) };
  
  const int imin = quartet_name[0].IsNotEmpty() ? 0 : 1;
  const int imax = (quartet_name[1].IsNotEmpty() && (quartet_name[0].IsEmpty() || quartet_name_hash[0] != quartet_name_hash[1])) ? 1 : 0;

  for (int i = imin; i <= imax; ++i)
  {
    ON_FontFaceQuartet installed_quartet = ON_Font::InstalledFontList().QuartetFromQuartetName(quartet_name[i]);
    if (installed_quartet.IsNotEmpty())
      return installed_quartet;
  }

  for (int i = imin; i <= imax; ++i)
  {
    ON_FontFaceQuartet managed_quartet = ON_Font::ManagedFontList().QuartetFromQuartetName(quartet_name[i]);
    if (managed_quartet.IsNotEmpty())
      return managed_quartet;
  }

  return ON_FontFaceQuartet::Empty;
}